

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineHuge.cpp
# Opt level: O1

void anon_unknown.dwarf_11e136::readWriteTest
               (int channelCount,int testTimes,bool random_channel_data,string *fn)

{
  ushort uVar1;
  PixelType PVar2;
  LineOrder LVar3;
  size_t __n;
  undefined1 auVar4 [16];
  int *piVar5;
  Array2D<void_*> *pAVar6;
  Data *pDVar7;
  bool bVar8;
  undefined2 uVar9;
  short sVar10;
  int j_2;
  int iVar11;
  uint uVar12;
  ostream *poVar13;
  ChannelList *pCVar14;
  undefined8 *puVar15;
  void *pvVar16;
  void *pvVar17;
  Header *this;
  Box2i *pBVar18;
  Box2i *pBVar19;
  float *pfVar20;
  V2f *pVVar21;
  V2f *pVVar22;
  LineOrder *pLVar23;
  Compression *pCVar24;
  ChannelList *other;
  string *psVar25;
  string *psVar26;
  void *pvVar27;
  undefined4 uVar28;
  void **ppvVar29;
  void **ppvVar30;
  int j_1;
  Compression CVar31;
  PixelType PVar32;
  undefined4 in_register_00000034;
  long lVar33;
  undefined1 xtc;
  ulong in_R10;
  undefined8 uVar34;
  ulong uVar35;
  ulong uVar36;
  size_t sVar37;
  int j;
  long lVar38;
  int k;
  int iVar39;
  long lVar40;
  long lVar41;
  uif uVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar48;
  Array<Imf_2_5::Array2D<void_*>_> data;
  DeepScanLineOutputFile file;
  int type;
  undefined4 uStack_2a4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined8 *local_288;
  int local_27c;
  int local_278;
  uif x;
  uint local_270;
  uif local_26c;
  DeepFrameBuffer frameBuffer;
  DeepSlice local_1f0;
  stringstream ss;
  size_t local_1a8 [14];
  ios_base local_138 [264];
  
  local_288 = (undefined8 *)CONCAT44(in_register_00000034,testTimes);
  local_278 = channelCount;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing files with ",0x13);
  poVar13 = (ostream *)std::ostream::operator<<(&std::cout,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," channels ",10);
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar13," times.",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
  std::ostream::put((char)poVar13);
  std::ostream::flush();
  std::ostream::flush();
  uVar35 = 0;
  do {
    local_27c = (int)uVar35;
    CVar31 = local_27c + (int)(uVar35 / 3) * -3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"generating ... ",0xf);
    std::ostream::flush();
    frameBuffer._map._M_t._M_impl._0_8_ = 0;
    Imf_2_5::Header::Header
              ((Header *)&ss,(Box2i *)(anonymous_namespace)::displayWindow,
               (Box2i *)&(anonymous_namespace)::dataWindow,1.0,(V2f *)&frameBuffer,1.0,INCREASING_Y,
               CVar31);
    Imf_2_5::Header::operator=((Header *)(anonymous_namespace)::header,(Header *)&ss);
    Imf_2_5::Header::~Header((Header *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
    poVar13 = (ostream *)std::ostream::operator<<(&std::cout,CVar31);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
    std::ostream::flush();
    if (DAT_0043e518._M_current != (anonymous_namespace)::channelTypes) {
      DAT_0043e518._M_current = (anonymous_namespace)::channelTypes;
    }
    iVar39 = 0;
    do {
      type = random_int(3);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,iVar39);
      std::__cxx11::stringbuf::str();
      if (type == 0) {
        pCVar14 = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
        Imf_2_5::Channel::Channel((Channel *)&local_1f0,UINT,1,1,false);
        Imf_2_5::ChannelList::insert(pCVar14,(string *)&frameBuffer,(Channel *)&local_1f0);
      }
      if (type == 1) {
        pCVar14 = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
        Imf_2_5::Channel::Channel((Channel *)&local_1f0,HALF,1,1,false);
        Imf_2_5::ChannelList::insert(pCVar14,(string *)&frameBuffer,(Channel *)&local_1f0);
      }
      if (type == 2) {
        pCVar14 = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
        Imf_2_5::Channel::Channel((Channel *)&local_1f0,FLOAT,1,1,false);
        Imf_2_5::ChannelList::insert(pCVar14,(string *)&frameBuffer,(Channel *)&local_1f0);
      }
      if (DAT_0043e518._M_current == DAT_0043e520) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::channelTypes,
                   DAT_0043e518,&type);
      }
      else {
        *DAT_0043e518._M_current = type;
        DAT_0043e518._M_current = DAT_0043e518._M_current + 1;
      }
      if ((_Base_ptr *)frameBuffer._map._M_t._M_impl._0_8_ !=
          &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)frameBuffer._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(frameBuffer._map._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_parent)->_M_color + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      iVar39 = iVar39 + 1;
    } while (iVar39 != 10);
    Imf_2_5::Header::setType
              ((Header *)(anonymous_namespace)::header,(string *)Imf_2_5::DEEPSCANLINE_abi_cxx11_);
    puVar15 = (undefined8 *)operator_new__(0xf8);
    *puVar15 = 10;
    memset((Array2D<void_*> *)(puVar15 + 1),0,0xf0);
    data._size = 10;
    lVar38 = 0x10;
    data._data = (Array2D<void_*> *)(puVar15 + 1);
    do {
      pAVar6 = data._data;
      pvVar16 = operator_new__(0x10008);
      pvVar17 = *(void **)((long)&pAVar6->_sizeX + lVar38);
      if (pvVar17 != (void *)0x0) {
        operator_delete__(pvVar17);
      }
      xtc = (undefined1)in_R10;
      *(undefined8 *)((long)pAVar6 + lVar38 + -0x10) = 1;
      *(undefined8 *)((long)pAVar6 + lVar38 + -8) = 0x2001;
      *(void **)((long)&pAVar6->_sizeX + lVar38) = pvVar16;
      lVar38 = lVar38 + 0x18;
    } while (lVar38 != 0x100);
    pvVar17 = operator_new__(0x8004);
    if ((anonymous_namespace)::sampleCount._16_8_ != 0) {
      operator_delete__((void *)(anonymous_namespace)::sampleCount._16_8_);
    }
    puVar15 = local_288;
    (anonymous_namespace)::sampleCount._0_8_ = 1;
    (anonymous_namespace)::sampleCount._8_8_ = 0x2001;
    (anonymous_namespace)::sampleCount._16_8_ = pvVar17;
    remove((char *)*local_288);
    Imf_2_5::DeepScanLineOutputFile::DeepScanLineOutputFile
              (&file,(char *)*puVar15,(Header *)(anonymous_namespace)::header,8);
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_2_5::Slice::Slice
              (&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)xtc,
               SUB81(frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
    Imf_2_5::Slice::Slice
              ((Slice *)&ss,UINT,
               (char *)((anonymous_namespace)::sampleCount._16_8_ +
                        (long)(anonymous_namespace)::dataWindow * -4 + (long)DAT_0043e4f4 * -0x8004)
               ,4,0x8004,1,1,0.0,(bool)xtc,(bool)((char)DAT_0043e4f4 * '\x04'));
    Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&frameBuffer,(Slice *)&ss);
    lVar38 = 0;
    lVar40 = 0;
    uVar35 = 0;
    do {
      PVar2 = (anonymous_namespace)::channelTypes[lVar40];
      PVar32 = (uint)(PVar2 != UINT) * 3;
      if (PVar2 == HALF) {
        PVar32 = PVar2;
      }
      if (PVar2 == FLOAT) {
        PVar32 = PVar2;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)lVar40);
      std::__cxx11::stringbuf::str();
      iVar39 = (anonymous_namespace)::channelTypes[lVar40];
      sVar37 = (ulong)(iVar39 == 0) << 2;
      uVar34 = 1;
      if (iVar39 == 1) {
        sVar37 = 2;
      }
      if (iVar39 == 2) {
        sVar37 = 4;
      }
      Imf_2_5::DeepSlice::DeepSlice
                (&local_1f0,PVar32,
                 (char *)(*(long *)((long)&(data._data)->_data + lVar38) +
                          (long)(anonymous_namespace)::dataWindow * -8 +
                         (long)DAT_0043e4f4 * -0x10008),8,0x10008,sVar37,1,1,0.0,false,false);
      Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,(string *)&type,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_2a4,type) != &local_298) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_2a4,type),local_298._M_allocated_capacity + 1);
      }
      uVar35 = uVar35 + sVar37;
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      lVar40 = lVar40 + 1;
      lVar38 = lVar38 + 0x18;
    } while (lVar40 != 10);
    Imf_2_5::DeepScanLineOutputFile::setFrameBuffer(&file,&frameBuffer);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar35;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  generating approx. ",0x15);
    iVar39 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1fff0)) / auVar4,0);
    poVar13 = (ostream *)std::ostream::operator<<(&std::cout,iVar39);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," samples per pixel\n",0x13);
    lVar38 = 0;
    lVar40 = 0;
    do {
      iVar11 = random_int(4000);
      uVar12 = iVar11 + iVar39 + -2000;
      *(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar38 * 4) = uVar12;
      lVar40 = lVar40 + (ulong)uVar12;
      lVar38 = lVar38 + 1;
    } while (lVar38 != 0x2001);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  total number of samples: ",0x1b);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  storage required: ",0x14);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," bytes (",8);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"GiB)",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &(anonymous_namespace)::storage,lVar40 * uVar35);
    uVar35 = 0;
    lVar38 = 0;
    do {
      iVar39 = (int)uVar35 + (int)((uVar35 & 0xffffffff) / 0x801) * -0x801;
      uVar42.f = (float)iVar39;
      ppvVar29 = (void **)(ulong)(uVar42.i >> 0x17);
      local_270 = (uVar42.i & 0x7fffff) + 0xfff + (uint)((uVar42.i >> 0xd & 1) != 0) >> 0xd;
      lVar40 = 0;
      x.f = uVar42.f;
      local_26c.f = uVar42.f;
      do {
        ppvVar30 = data._data[lVar40]._data;
        ppvVar30[uVar35] = (void *)((anonymous_namespace)::storage + lVar38);
        iVar11 = (anonymous_namespace)::channelTypes[lVar40];
        if (iVar11 == 0) {
          ppvVar30 = (void **)(ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ +
                                              uVar35 * 4);
          lVar38 = lVar38 + (long)ppvVar30 * 4;
        }
        if (iVar11 == 1) {
          ppvVar30 = (void **)(ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ +
                                              uVar35 * 4);
          lVar38 = lVar38 + (long)ppvVar30 * 2;
        }
        uVar28 = SUB84(ppvVar30,0);
        if (iVar11 == 2) {
          lVar38 = lVar38 + (ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ + uVar35 * 4)
                            * 4;
        }
        iVar11 = *(int *)((anonymous_namespace)::sampleCount._16_8_ + uVar35 * 4);
        if ((char)local_278 == '\0') {
          if (iVar11 != 0) {
            uVar36 = 0;
            do {
              piVar5 = (anonymous_namespace)::channelTypes;
              if ((anonymous_namespace)::channelTypes[lVar40] == 0) {
                ppvVar30 = (void **)data._data[lVar40]._data[uVar35];
                *(int *)((long)ppvVar30 + uVar36 * 4) = iVar39;
              }
              if (piVar5[lVar40] == 1) {
                pvVar17 = data._data[lVar40]._data[uVar35];
                sVar10 = (short)(uVar42.i >> 0x10);
                if (iVar39 != 0) {
                  sVar10 = *(short *)((long)&half::_eLut + (long)ppvVar29 * 2);
                  ppvVar30 = ppvVar29;
                  if (sVar10 == 0) {
                    sVar10 = half::convert(x.i);
                  }
                  else {
                    sVar10 = sVar10 + (short)local_270;
                  }
                }
                *(short *)((long)pvVar17 + uVar36 * 2) = sVar10;
              }
              uVar28 = SUB84(ppvVar30,0);
              if ((anonymous_namespace)::channelTypes[lVar40] == 2) {
                ((uif *)((long)data._data[lVar40]._data[uVar35] + uVar36 * 4))->i = (uint)local_26c;
              }
              uVar36 = uVar36 + 1;
            } while (uVar36 < *(uint *)((anonymous_namespace)::sampleCount._16_8_ + uVar35 * 4));
          }
        }
        else if (iVar11 != 0) {
          uVar36 = 0;
          do {
            if ((anonymous_namespace)::channelTypes[lVar40] == 0) {
              iVar11 = random_int(0x7fffffff);
              ppvVar30 = (void **)data._data[lVar40]._data[uVar35];
              *(int *)((long)ppvVar30 + uVar36 * 4) = iVar11;
            }
            if ((anonymous_namespace)::channelTypes[lVar40] == 1) {
              fVar43 = random_float(3.4028235e+38);
              pvVar17 = data._data[lVar40]._data[uVar35];
              if ((fVar43 != 0.0) || (NAN(fVar43))) {
                uVar1 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar43 >> 0x17) * 2);
                ppvVar30 = (void **)(ulong)uVar1;
                if (uVar1 == 0) {
                  uVar9 = half::convert((int)fVar43);
                }
                else {
                  uVar12 = (uint)uVar1 +
                           (((uint)fVar43 & 0x7fffff) + 0xfff +
                            (uint)(((uint)fVar43 >> 0xd & 1) != 0) >> 0xd);
                  ppvVar30 = (void **)(ulong)uVar12;
                  uVar9 = (undefined2)uVar12;
                }
              }
              else {
                uVar9 = (undefined2)((uint)fVar43 >> 0x10);
              }
              *(undefined2 *)((long)pvVar17 + uVar36 * 2) = uVar9;
            }
            if ((anonymous_namespace)::channelTypes[lVar40] == 2) {
              fVar43 = random_float(3.4028235e+38);
              *(float *)((long)data._data[lVar40]._data[uVar35] + uVar36 * 4) = fVar43;
            }
            uVar28 = SUB84(ppvVar30,0);
            uVar36 = uVar36 + 1;
          } while (uVar36 < *(uint *)((anonymous_namespace)::sampleCount._16_8_ + uVar35 * 4));
        }
        lVar40 = lVar40 + 1;
      } while (lVar40 != 10);
      uVar35 = uVar35 + 1;
    } while (uVar35 != 0x2001);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," data prepared, writing ...",0x1b);
    Imf_2_5::DeepScanLineOutputFile::writePixels(&file,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," data written\n",0xe);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                 *)&frameBuffer);
    Imf_2_5::DeepScanLineOutputFile::~DeepScanLineOutputFile(&file);
    Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array(&data);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading \n",9);
    std::ostream::flush();
    Imf_2_5::DeepScanLineInputFile::DeepScanLineInputFile
              ((DeepScanLineInputFile *)&data,(char *)*local_288,8);
    this = Imf_2_5::DeepScanLineInputFile::header((DeepScanLineInputFile *)&data);
    pBVar18 = Imf_2_5::Header::displayWindow(this);
    pBVar19 = Imf_2_5::Header::displayWindow((Header *)(anonymous_namespace)::header);
    iVar39 = -(uint)((pBVar19->min).x == (pBVar18->min).x);
    iVar11 = -(uint)((pBVar19->min).y == (pBVar18->min).y);
    auVar44._4_4_ = iVar39;
    auVar44._0_4_ = iVar39;
    auVar44._8_4_ = iVar11;
    auVar44._12_4_ = iVar11;
    iVar39 = movmskpd(uVar28,auVar44);
    if ((iVar39 != 3) ||
       (iVar11 = -(uint)((pBVar19->max).x == (pBVar18->max).x),
       iVar48 = -(uint)((pBVar19->max).y == (pBVar18->max).y), auVar45._4_4_ = iVar11,
       auVar45._0_4_ = iVar11, auVar45._8_4_ = iVar48, auVar45._12_4_ = iVar48,
       iVar11 = movmskpd((int)pBVar19,auVar45), iVar11 != 3)) {
      __assert_fail("fileHeader.displayWindow() == header.displayWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineHuge.cpp"
                    ,0x116,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pBVar18 = Imf_2_5::Header::dataWindow(this);
    pBVar19 = Imf_2_5::Header::dataWindow((Header *)(anonymous_namespace)::header);
    iVar11 = -(uint)((pBVar19->min).x == (pBVar18->min).x);
    iVar48 = -(uint)((pBVar19->min).y == (pBVar18->min).y);
    auVar46._4_4_ = iVar11;
    auVar46._0_4_ = iVar11;
    auVar46._8_4_ = iVar48;
    auVar46._12_4_ = iVar48;
    iVar39 = movmskpd(iVar39,auVar46);
    if ((iVar39 != 3) ||
       (iVar39 = -(uint)((pBVar19->max).x == (pBVar18->max).x),
       iVar11 = -(uint)((pBVar19->max).y == (pBVar18->max).y), auVar47._4_4_ = iVar39,
       auVar47._0_4_ = iVar39, auVar47._8_4_ = iVar11, auVar47._12_4_ = iVar11,
       iVar39 = movmskpd((int)pBVar19,auVar47), iVar39 != 3)) {
      __assert_fail("fileHeader.dataWindow() == header.dataWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineHuge.cpp"
                    ,0x117,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pfVar20 = Imf_2_5::Header::pixelAspectRatio(this);
    fVar43 = *pfVar20;
    pfVar20 = Imf_2_5::Header::pixelAspectRatio((Header *)(anonymous_namespace)::header);
    if ((fVar43 != *pfVar20) || (NAN(fVar43) || NAN(*pfVar20))) {
      __assert_fail("fileHeader.pixelAspectRatio() == header.pixelAspectRatio()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineHuge.cpp"
                    ,0x118,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pVVar21 = Imf_2_5::Header::screenWindowCenter(this);
    pVVar22 = Imf_2_5::Header::screenWindowCenter((Header *)(anonymous_namespace)::header);
    if ((((pVVar21->x != pVVar22->x) || (NAN(pVVar21->x) || NAN(pVVar22->x))) ||
        (pVVar21->y != pVVar22->y)) || (NAN(pVVar21->y) || NAN(pVVar22->y))) {
      __assert_fail("fileHeader.screenWindowCenter() == header.screenWindowCenter()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineHuge.cpp"
                    ,0x119,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pfVar20 = Imf_2_5::Header::screenWindowWidth(this);
    fVar43 = *pfVar20;
    pfVar20 = Imf_2_5::Header::screenWindowWidth((Header *)(anonymous_namespace)::header);
    if ((fVar43 != *pfVar20) || (NAN(fVar43) || NAN(*pfVar20))) {
      __assert_fail("fileHeader.screenWindowWidth() == header.screenWindowWidth()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineHuge.cpp"
                    ,0x11a,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pLVar23 = Imf_2_5::Header::lineOrder(this);
    LVar3 = *pLVar23;
    pLVar23 = Imf_2_5::Header::lineOrder((Header *)(anonymous_namespace)::header);
    if (LVar3 != *pLVar23) {
      __assert_fail("fileHeader.lineOrder() == header.lineOrder()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineHuge.cpp"
                    ,0x11b,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pCVar24 = Imf_2_5::Header::compression(this);
    CVar31 = *pCVar24;
    pCVar24 = Imf_2_5::Header::compression((Header *)(anonymous_namespace)::header);
    if (CVar31 != *pCVar24) {
      __assert_fail("fileHeader.compression() == header.compression()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineHuge.cpp"
                    ,0x11c,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pCVar14 = Imf_2_5::Header::channels(this);
    other = Imf_2_5::Header::channels((Header *)(anonymous_namespace)::header);
    bVar8 = Imf_2_5::ChannelList::operator==(pCVar14,other);
    if (!bVar8) {
      __assert_fail("fileHeader.channels() == header.channels()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineHuge.cpp"
                    ,0x11d,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    psVar25 = Imf_2_5::Header::type_abi_cxx11_(this);
    psVar26 = Imf_2_5::Header::type_abi_cxx11_((Header *)(anonymous_namespace)::header);
    __n = psVar25->_M_string_length;
    if ((__n != psVar26->_M_string_length) ||
       ((__n != 0 &&
        (iVar39 = bcmp((psVar25->_M_dataplus)._M_p,(psVar26->_M_dataplus)._M_p,__n), iVar39 != 0))))
    {
      __assert_fail("fileHeader.type() == header.type()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineHuge.cpp"
                    ,0x11e,"void (anonymous namespace)::readFile(int, bool, const std::string &)");
    }
    pvVar17 = operator_new__(0x8004);
    puVar15 = (undefined8 *)operator_new__(0xf8);
    *puVar15 = 10;
    memset((Data *)(puVar15 + 1),0,0xf0);
    file.super_GenericOutputFile._vptr_GenericOutputFile = (_func_int **)0xa;
    lVar38 = 0x10;
    file._data = (Data *)(puVar15 + 1);
    do {
      pDVar7 = file._data;
      pvVar27 = operator_new__(0x10008);
      pvVar16 = *(void **)(&(pDVar7->header)._map._M_t._M_impl.field_0x0 + lVar38);
      if (pvVar16 != (void *)0x0) {
        operator_delete__(pvVar16);
      }
      bVar8 = SUB81(uVar34,0);
      *(undefined8 *)((long)pDVar7 + lVar38 + -0x10) = 1;
      *(undefined8 *)((long)pDVar7 + lVar38 + -8) = 0x2001;
      *(void **)(&(pDVar7->header)._map._M_t._M_impl.field_0x0 + lVar38) = pvVar27;
      lVar38 = lVar38 + 0x18;
    } while (lVar38 != 0x100);
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_2_5::Slice::Slice
              (&frameBuffer._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,bVar8,
               SUB81(frameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0));
    Imf_2_5::Slice::Slice
              ((Slice *)&ss,UINT,
               (char *)((long)pvVar17 +
                       (long)DAT_0043e4f4 * -0x8004 + (long)(anonymous_namespace)::dataWindow * -4),
               4,0x8004,1,1,0.0,bVar8,(bool)((char)DAT_0043e4f4 * '\x04'));
    Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&frameBuffer,(Slice *)&ss);
    lVar38 = 0;
    lVar41 = 0;
    lVar40 = 0;
    do {
      PVar2 = (anonymous_namespace)::channelTypes[lVar41];
      PVar32 = (uint)(PVar2 != UINT) * 3;
      if (PVar2 == HALF) {
        PVar32 = PVar2;
      }
      if (PVar2 == FLOAT) {
        PVar32 = PVar2;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::ostream::operator<<(local_1a8,(int)lVar41);
      std::__cxx11::stringbuf::str();
      iVar39 = (anonymous_namespace)::channelTypes[lVar41];
      sVar37 = (ulong)(iVar39 == 0) << 2;
      in_R10 = 1;
      if (iVar39 == 1) {
        sVar37 = 2;
      }
      if (iVar39 == 2) {
        sVar37 = 4;
      }
      Imf_2_5::DeepSlice::DeepSlice
                (&local_1f0,PVar32,
                 (char *)(*(long *)((long)&((file._data)->header)._map._M_t._M_impl.
                                           super__Rb_tree_header._M_header._M_parent + lVar38) +
                          (long)(anonymous_namespace)::dataWindow * -8 +
                         (long)DAT_0043e4f4 * -0x10008),8,0x10008,sVar37,1,1,0.0,false,false);
      Imf_2_5::DeepFrameBuffer::insert(&frameBuffer,(string *)&type,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(uStack_2a4,type) != &local_298) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(uStack_2a4,type),local_298._M_allocated_capacity + 1);
      }
      lVar40 = lVar40 + sVar37;
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      lVar41 = lVar41 + 1;
      lVar38 = lVar38 + 0x18;
    } while (lVar41 != 10);
    Imf_2_5::DeepScanLineInputFile::setFrameBuffer((DeepScanLineInputFile *)&data,&frameBuffer);
    Imf_2_5::DeepScanLineInputFile::readPixelSampleCounts
              ((DeepScanLineInputFile *)&data,DAT_0043e4f4,DAT_0043e4fc);
    if (DAT_0043e4fc < DAT_0043e4f4) {
      lVar41 = 0;
    }
    else {
      uVar35 = 0;
      lVar41 = 0;
      lVar38 = (anonymous_namespace)::sampleCount._16_8_;
      pvVar16 = pvVar17;
      do {
        lVar33 = 0;
        do {
          uVar12 = *(uint *)((long)pvVar16 + lVar33 * 4);
          in_R10 = (ulong)uVar12;
          if (uVar12 != *(uint *)(lVar38 + lVar33 * 4)) {
            __assert_fail("localSampleCount[i][j] == sampleCount[i][j]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testDeepScanLineHuge.cpp"
                          ,0x15b,
                          "void (anonymous namespace)::readFile(int, bool, const std::string &)");
          }
          lVar41 = lVar41 + in_R10;
          lVar33 = lVar33 + 1;
        } while (lVar33 != 0x2001);
        uVar35 = uVar35 + 1;
        lVar38 = lVar38 + (anonymous_namespace)::sampleCount._8_8_ * 4;
        pvVar16 = (void *)((long)pvVar16 + 0x8004);
      } while (uVar35 != (DAT_0043e4fc - DAT_0043e4f4) + 1);
    }
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&ss,lVar41 * lVar40,
               (allocator_type *)&local_1f0);
    lVar40 = 0;
    lVar38 = 0;
    do {
      lVar41 = 0;
      lVar33 = 0;
      do {
        *(long *)(*(long *)((long)&((file._data)->header)._map._M_t._M_impl.super__Rb_tree_header.
                                   _M_header._M_parent + lVar41) + lVar40 * 8) = (long)_ss + lVar38;
        iVar39 = (anonymous_namespace)::channelTypes[lVar33];
        if (iVar39 == 0) {
          lVar38 = lVar38 + (ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar40 * 4)
                            * 4;
        }
        if (iVar39 == 1) {
          lVar38 = lVar38 + (ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar40 * 4)
                            * 2;
        }
        if (iVar39 == 2) {
          lVar38 = lVar38 + (ulong)*(uint *)((anonymous_namespace)::sampleCount._16_8_ + lVar40 * 4)
                            * 4;
        }
        lVar33 = lVar33 + 1;
        lVar41 = lVar41 + 0x18;
      } while (lVar33 != 10);
      lVar40 = lVar40 + 1;
    } while (lVar40 != 0x2001);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"reading image data ... ",0x17);
    std::ostream::flush();
    Imf_2_5::DeepScanLineInputFile::readPixels
              ((DeepScanLineInputFile *)&data,DAT_0043e4f4,DAT_0043e4fc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," image read \n",0xd);
    std::ostream::flush();
    if (_ss != (void *)0x0) {
      operator_delete(_ss,local_1a8[0] - (long)_ss);
    }
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                 *)&frameBuffer);
    Imf_2_5::Array<Imf_2_5::Array2D<void_*>_>::~Array((Array<Imf_2_5::Array2D<void_*>_> *)&file);
    operator_delete__(pvVar17);
    Imf_2_5::DeepScanLineInputFile::~DeepScanLineInputFile((DeepScanLineInputFile *)&data);
    remove((char *)*local_288);
    uVar35 = (ulong)(local_27c + 1U);
  } while (local_27c + 1U != 5);
  return;
}

Assistant:

void
readWriteTest (int channelCount,
               int testTimes,
               bool random_channel_data,
               const std::string & fn)
{
    cout << "Testing files with " << channelCount << " channels " << testTimes << " times."
         << endl << flush;
    for (int i = 0; i < testTimes; i++)
    {
        int compressionIndex = i % 3;
        Compression compression;
        switch (compressionIndex)
        {
            case 0:
                compression = NO_COMPRESSION;
                break;
            case 1:
                compression = RLE_COMPRESSION;
                break;
            case 2:
                compression = ZIPS_COMPRESSION;
                break;
        }

        generateRandomFile (channelCount, compression, random_channel_data, fn);
        readFile (channelCount, false, fn);
        remove (fn.c_str());
     
    }
}